

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O2

int Fax4Decode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uchar uVar4;
  uint32_t lastx;
  uint8_t *puVar5;
  long lVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  int iVar9;
  byte *pbVar10;
  ulong uVar11;
  uint32_t *puVar12;
  int iVar13;
  undefined6 in_register_0000000a;
  uint32_t *puVar14;
  byte *pbVar15;
  uint32_t uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  TIFFFaxTabEnt *pTVar20;
  char *pcVar21;
  uint32_t uVar22;
  int iVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint uVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  byte *local_88;
  uint32_t *local_80;
  int local_78;
  int local_54;
  
  puVar5 = tif->tif_data;
  if (occ % *(long *)(puVar5 + 8) != 0) {
    TIFFErrorExtR(tif,"Fax4Decode","Fractional scanlines cannot be read",
                  CONCAT62(in_register_0000000a,s));
    return -1;
  }
  lastx = *(uint32_t *)(puVar5 + 0x10);
  lVar6 = *(long *)(puVar5 + 0x40);
  uVar26 = *(uint *)(puVar5 + 0x48);
  iVar23 = *(int *)(puVar5 + 0x4c);
  local_54 = *(int *)(puVar5 + 0x50);
  local_88 = tif->tif_rawcp;
  pbVar10 = local_88 + tif->tif_rawcc;
  iVar9 = (int)(lastx + 7) >> 3;
LAB_002555e5:
  if (occ < 1) {
    *(int *)(puVar5 + 0x4c) = iVar23;
    *(uint *)(puVar5 + 0x48) = uVar26;
    *(int *)(puVar5 + 0x50) = local_54;
    tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)local_88));
    tif->tif_rawcp = local_88;
    return 1;
  }
  puVar7 = *(uint32_t **)(puVar5 + 0x70);
  puVar8 = *(uint32_t **)(puVar5 + 0x78);
  puVar12 = puVar7 + 1;
  uVar16 = *puVar7;
  uVar22 = 0;
  local_80 = puVar8;
LAB_00255612:
  uVar24 = 0;
  uVar25 = uVar22;
  do {
    uVar22 = lastx - uVar25;
    if (uVar22 == 0 || (int)lastx < (int)uVar25) {
      if (uVar24 == 0) goto LAB_00255f20;
      if ((int)(uVar25 + uVar24) < (int)lastx) {
        if (iVar23 < 1) {
          if (local_88 < pbVar10) {
            bVar3 = *local_88;
            local_88 = local_88 + 1;
            uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)bVar3) << ((byte)iVar23 & 0x1f);
            iVar23 = iVar23 + 8;
          }
          else {
            if (iVar23 == 0) goto LAB_00256113;
            iVar23 = 1;
          }
        }
        if ((uVar26 & 1) == 0) goto switchD_002556ba_caseD_7;
        iVar23 = iVar23 + -1;
        uVar26 = uVar26 >> 1;
      }
      if (local_80 < puVar8 + *(uint *)(puVar5 + 0x68)) goto LAB_00255f19;
      goto LAB_00256327;
    }
    uVar17 = *(uint *)(puVar5 + 0x68);
    if (puVar8 + uVar17 <= local_80) goto LAB_00256327;
    if (iVar23 < 7) {
      if (local_88 < pbVar10) {
        bVar3 = *local_88;
        local_88 = local_88 + 1;
        uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)bVar3) << ((byte)iVar23 & 0x1f);
        iVar23 = iVar23 + 8;
      }
      else {
        bVar27 = iVar23 == 0;
        iVar23 = 7;
        if (bVar27) goto LAB_00256113;
      }
    }
    uVar19 = uVar26 & 0x7f;
    uVar26 = uVar26 >> (TIFFFaxMainTable[uVar19].Width & 0x1f);
    iVar23 = iVar23 - (uint)TIFFFaxMainTable[uVar19].Width;
    switch(TIFFFaxMainTable[uVar19].State) {
    case '\x01':
      if (local_80 != puVar8) {
        puVar12 = puVar12 + 1;
        for (; (int)uVar16 <= (int)uVar25; uVar16 = uVar16 + *puVar14 + uVar22) {
          if (puVar7 + uVar17 <= puVar12) goto LAB_00256327;
          puVar14 = puVar12 + -1;
          uVar22 = *puVar12;
          puVar12 = puVar12 + 2;
        }
        puVar12 = puVar12 + -1;
      }
      if (puVar7 + uVar17 <= puVar12 + 1) goto LAB_00256327;
      uVar22 = uVar16 + *puVar12;
      uVar24 = (uVar24 - uVar25) + uVar22;
      uVar16 = puVar12[1] + uVar22;
      puVar12 = puVar12 + 2;
      uVar25 = uVar22;
      break;
    case '\x02':
      goto switchD_002556ba_caseD_2;
    case '\x03':
      uVar22 = uVar16;
      if (local_80 == puVar8) goto LAB_00255bb0;
      puVar12 = puVar12 + 1;
      goto LAB_0025577f;
    case '\x04':
      if (local_80 == puVar8) goto LAB_00255beb;
      puVar12 = puVar12 + 1;
      goto LAB_002557b8;
    case '\x05':
      if (local_80 == puVar8) goto LAB_00255b66;
      puVar12 = puVar12 + 1;
      goto LAB_00255741;
    case '\x06':
      *local_80 = uVar22;
      local_80 = local_80 + 1;
      Fax3Extension("Fax4Decode",tif,*(uint32_t *)(puVar5 + 0x98),uVar25);
      goto LAB_00255ec8;
    default:
      goto switchD_002556ba_caseD_7;
    case '\f':
      *local_80 = uVar22;
      local_80 = local_80 + 1;
      if (iVar23 < 4) {
        if (local_88 < pbVar10) {
          bVar3 = *local_88;
          local_88 = local_88 + 1;
          uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)bVar3) << ((byte)iVar23 & 0x1f);
          iVar23 = iVar23 + 8;
        }
        else {
          bVar27 = iVar23 == 0;
          iVar23 = 4;
          if (bVar27) goto LAB_00256113;
        }
      }
      if ((uVar26 & 0xf) != 0) {
        Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar5 + 0x98),uVar25);
      }
      iVar23 = iVar23 + -4;
      uVar26 = uVar26 >> 4;
      local_54 = 1;
      goto LAB_00255ec8;
    }
  } while( true );
LAB_00255741:
  if ((int)uVar25 < (int)uVar16) goto LAB_00255b62;
  if (puVar7 + uVar17 <= puVar12) goto LAB_00256327;
  uVar16 = uVar16 + puVar12[-1] + *puVar12;
  puVar12 = puVar12 + 2;
  goto LAB_00255741;
LAB_00255b62:
  puVar12 = puVar12 + -1;
LAB_00255b66:
  iVar18 = TIFFFaxMainTable[uVar19].Param + uVar25;
  iVar13 = uVar16 - iVar18;
  if ((int)uVar16 < iVar18) goto switchD_002556ba_caseD_7;
  *local_80 = uVar24 + iVar13;
  uVar22 = uVar25 + iVar13;
  uVar16 = uVar16 - puVar12[-1];
  puVar12 = puVar12 + -1;
  local_80 = local_80 + 1;
  goto LAB_00255612;
switchD_002556ba_caseD_7:
  uVar16 = *(uint32_t *)(puVar5 + 0x98);
LAB_00255eb4:
  Fax3Unexpected("Fax4Decode",tif,uVar16,uVar25);
LAB_00255ec8:
  if (uVar24 != 0) {
    if (puVar8 + *(uint *)(puVar5 + 0x68) <= local_80) goto LAB_00256327;
LAB_00255f19:
    *local_80 = uVar24;
    local_80 = local_80 + 1;
  }
LAB_00255f20:
  if (uVar25 != lastx) {
    Fax3BadLength("Fax4Decode",tif,*(uint32_t *)(puVar5 + 0x98),uVar25,lastx);
    uVar11 = (long)local_80 - (long)puVar8;
    for (; ((int)lastx < (int)uVar25 && (puVar8 < local_80)); local_80 = local_80 + -1) {
      uVar25 = uVar25 - local_80[-1];
      uVar11 = uVar11 - 4;
    }
    if ((int)uVar25 < (int)lastx) {
      if ((int)uVar25 < 1) {
        uVar25 = 0;
      }
      if ((uVar11 & 4) != 0) {
        if (puVar8 + *(uint *)(puVar5 + 0x68) <= local_80) goto LAB_00256327;
        *local_80 = 0;
        local_80 = local_80 + 1;
      }
      if (puVar8 + *(uint *)(puVar5 + 0x68) <= local_80) goto LAB_00256327;
      *local_80 = lastx - uVar25;
      local_80 = local_80 + 1;
    }
    else if ((int)lastx < (int)uVar25) {
      if ((puVar8 + *(uint *)(puVar5 + 0x68) <= local_80) ||
         (*local_80 = lastx, puVar8 + *(uint *)(puVar5 + 0x68) <= local_80 + 1)) goto LAB_00256327;
      local_80[1] = 0;
      local_80 = local_80 + 2;
    }
  }
  if (local_54 != 0) {
    pbVar15 = local_88;
    iVar13 = iVar23;
    if (iVar23 < 0xd) goto LAB_002561d1;
    goto LAB_00256393;
  }
  if ((int)occ < iVar9) goto LAB_0025639a;
  (**(code **)(puVar5 + 0x58))(buf,puVar8,local_80);
  if (puVar8 + *(uint *)(puVar5 + 0x68) <= local_80) {
LAB_0025615e:
    uVar26 = *(uint *)(puVar5 + 0x98);
    bVar27 = (tif->tif_flags >> 10 & 1) == 0;
    pcVar21 = "tile";
    if (bVar27) {
      pcVar21 = "strip";
    }
    puVar12 = &tif->tif_curtile;
    if (bVar27) {
      puVar12 = &tif->tif_curstrip;
    }
    uVar17 = *puVar12;
    goto LAB_0025636b;
  }
  *local_80 = 0;
  auVar2 = *(undefined1 (*) [16])(puVar5 + 0x70);
  auVar28._0_8_ = auVar2._8_8_;
  auVar28._8_4_ = auVar2._0_4_;
  auVar28._12_4_ = auVar2._4_4_;
  *(undefined1 (*) [16])(puVar5 + 0x70) = auVar28;
  buf = buf + *(long *)(puVar5 + 8);
  occ = occ - *(long *)(puVar5 + 8);
  *(int *)(puVar5 + 0x98) = *(int *)(puVar5 + 0x98) + 1;
  local_54 = 0;
  goto LAB_002555e5;
LAB_002557b8:
  if ((int)uVar25 < (int)uVar16) goto LAB_00255be7;
  if (puVar7 + uVar17 <= puVar12) goto LAB_00256327;
  uVar16 = uVar16 + puVar12[-1] + *puVar12;
  puVar12 = puVar12 + 2;
  goto LAB_002557b8;
LAB_00255be7:
  puVar12 = puVar12 + -1;
LAB_00255beb:
  uVar22 = TIFFFaxMainTable[uVar19].Param;
  *local_80 = (uVar24 - uVar25) + uVar16 + uVar22;
  if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar12) goto LAB_00256327;
  uVar22 = uVar22 + uVar16;
  uVar16 = uVar16 + *puVar12;
  puVar12 = puVar12 + 1;
  local_80 = local_80 + 1;
  goto LAB_00255612;
LAB_0025577f:
  if ((int)uVar25 < (int)uVar16) goto LAB_00255ba7;
  if (puVar7 + uVar17 <= puVar12) goto LAB_00256327;
  uVar16 = uVar16 + puVar12[-1] + *puVar12;
  puVar12 = puVar12 + 2;
  goto LAB_0025577f;
LAB_00255ba7:
  puVar12 = puVar12 + -1;
  uVar22 = uVar16;
LAB_00255bb0:
  *local_80 = (uVar24 - uVar25) + uVar22;
  if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar12) goto LAB_00256327;
  uVar16 = *puVar12 + uVar22;
  puVar12 = puVar12 + 1;
  local_80 = local_80 + 1;
  goto LAB_00255612;
switchD_002556ba_caseD_2:
  local_78 = (int)puVar8;
  pbVar15 = local_88;
  if (((int)local_80 - local_78 & 4U) == 0) {
    while( true ) {
      local_88 = pbVar15;
      iVar13 = iVar23;
      if (iVar23 < 0xc) {
        if (pbVar15 < pbVar10) {
          local_88 = pbVar15 + 1;
          uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)*pbVar15) << ((byte)iVar23 & 0x1f);
          iVar13 = iVar23 + 8;
          if (iVar23 < 4) {
            if (local_88 < pbVar10) {
              uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)pbVar15[1]) <<
                                ((byte)(iVar23 + 8) & 0x1f);
              local_88 = pbVar15 + 2;
              iVar13 = iVar23 + 0x10;
            }
            else {
              iVar13 = 0xc;
            }
          }
        }
        else {
          iVar13 = 0xc;
          if (iVar23 == 0) goto LAB_00256113;
        }
      }
      uVar17 = uVar26 & 0xfff;
      uVar26 = uVar26 >> (TIFFFaxWhiteTable[uVar17].Width & 0x1f);
      iVar23 = iVar13 - (uint)TIFFFaxWhiteTable[uVar17].Width;
      uVar4 = TIFFFaxWhiteTable[uVar17].State;
      if ((uVar4 != '\t') && (uVar4 != '\v')) break;
      uVar25 = uVar25 + TIFFFaxWhiteTable[uVar17].Param;
      uVar24 = uVar24 + TIFFFaxWhiteTable[uVar17].Param;
      pbVar15 = local_88;
    }
    puVar14 = local_80;
    if (uVar4 != '\a') {
LAB_00255e4e:
      local_80 = puVar14;
      Fax3Unexpected("Fax4Decode",tif,*(uint32_t *)(puVar5 + 0x98),uVar25);
      goto LAB_00255ec8;
    }
    uVar22 = TIFFFaxWhiteTable[uVar17].Param;
    *local_80 = uVar24 + uVar22;
    uVar25 = uVar25 + uVar22;
    uVar24 = 0;
    while( true ) {
      iVar13 = iVar23;
      pbVar15 = local_88;
      if (iVar23 < 0xd) {
        if (local_88 < pbVar10) {
          pbVar15 = local_88 + 1;
          uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)*local_88) << ((byte)iVar23 & 0x1f);
          iVar13 = iVar23 + 8;
          if (iVar23 < 5) {
            if (pbVar15 < pbVar10) {
              uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)local_88[1]) <<
                                ((byte)(iVar23 + 8) & 0x1f);
              iVar13 = iVar23 + 0x10;
              pbVar15 = local_88 + 2;
            }
            else {
              iVar13 = 0xd;
            }
          }
        }
        else {
          iVar13 = 0xd;
          if (iVar23 == 0) goto LAB_0025640d;
        }
      }
      local_88 = pbVar15;
      uVar17 = uVar26 & 0x1fff;
      pTVar20 = TIFFFaxBlackTable + uVar17;
      uVar26 = uVar26 >> (TIFFFaxBlackTable[uVar17].Width & 0x1f);
      iVar23 = iVar13 - (uint)TIFFFaxBlackTable[uVar17].Width;
      if (1 < pTVar20->State - 10) break;
      uVar25 = uVar25 + TIFFFaxBlackTable[uVar17].Param;
      uVar24 = uVar24 + TIFFFaxBlackTable[uVar17].Param;
    }
    puVar14 = local_80 + 1;
    if (pTVar20->State == 8) {
      if (puVar8 + *(uint *)(puVar5 + 0x68) <= local_80 + 1) goto LAB_00256327;
LAB_00255c77:
      uVar22 = pTVar20->Param;
      local_80[1] = uVar24 + uVar22;
      uVar22 = uVar25 + uVar22;
      puVar14 = local_80 + 2;
      local_80 = puVar8;
      if (puVar14 != puVar8) {
        puVar12 = puVar12 + 1;
        for (; ((int)uVar16 <= (int)uVar22 && ((int)uVar16 < (int)lastx));
            uVar16 = uVar16 + *puVar1 + uVar25) {
          if (puVar7 + *(uint *)(puVar5 + 0x68) <= puVar12) goto LAB_00256327;
          puVar1 = puVar12 + -1;
          uVar25 = *puVar12;
          puVar12 = puVar12 + 2;
        }
        puVar12 = puVar12 + -1;
        local_80 = puVar14;
      }
      goto LAB_00255612;
    }
  }
  else {
    while( true ) {
      local_88 = pbVar15;
      iVar13 = iVar23;
      if (iVar23 < 0xd) {
        if (pbVar15 < pbVar10) {
          local_88 = pbVar15 + 1;
          uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)*pbVar15) << ((byte)iVar23 & 0x1f);
          iVar13 = iVar23 + 8;
          if (iVar23 < 5) {
            if (local_88 < pbVar10) {
              local_88 = pbVar15 + 2;
              uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)pbVar15[1]) << ((byte)iVar13 & 0x1f);
              iVar13 = iVar23 + 0x10;
            }
            else {
              iVar13 = 0xd;
            }
          }
        }
        else {
          iVar13 = 0xd;
          if (iVar23 == 0) goto LAB_00256113;
        }
      }
      uVar17 = uVar26 & 0x1fff;
      uVar26 = uVar26 >> (TIFFFaxBlackTable[uVar17].Width & 0x1f);
      iVar23 = iVar13 - (uint)TIFFFaxBlackTable[uVar17].Width;
      if (1 < TIFFFaxBlackTable[uVar17].State - 10) break;
      uVar25 = uVar25 + TIFFFaxBlackTable[uVar17].Param;
      uVar24 = uVar24 + TIFFFaxBlackTable[uVar17].Param;
      pbVar15 = local_88;
    }
    puVar14 = local_80;
    if (TIFFFaxBlackTable[uVar17].State == 8) {
      uVar22 = TIFFFaxBlackTable[uVar17].Param;
      *local_80 = uVar24 + uVar22;
      uVar25 = uVar25 + uVar22;
      uVar24 = 0;
      pbVar15 = local_88;
      while( true ) {
        local_88 = pbVar15;
        iVar13 = iVar23;
        if (iVar23 < 0xc) {
          if (pbVar15 < pbVar10) {
            local_88 = pbVar15 + 1;
            uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)*pbVar15) << ((byte)iVar23 & 0x1f);
            iVar13 = iVar23 + 8;
            if (iVar23 < 4) {
              if (local_88 < pbVar10) {
                local_88 = pbVar15 + 2;
                uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)pbVar15[1]) <<
                                  ((byte)iVar13 & 0x1f);
                iVar13 = iVar23 + 0x10;
              }
              else {
                iVar13 = 0xc;
              }
            }
          }
          else {
            iVar13 = 0xc;
            if (iVar23 == 0) goto LAB_0025640d;
          }
        }
        uVar17 = uVar26 & 0xfff;
        pTVar20 = TIFFFaxWhiteTable + uVar17;
        uVar26 = uVar26 >> (TIFFFaxWhiteTable[uVar17].Width & 0x1f);
        iVar23 = iVar13 - (uint)TIFFFaxWhiteTable[uVar17].Width;
        uVar4 = pTVar20->State;
        if ((uVar4 != '\t') && (uVar4 != '\v')) break;
        uVar25 = uVar25 + TIFFFaxWhiteTable[uVar17].Param;
        uVar24 = uVar24 + TIFFFaxWhiteTable[uVar17].Param;
        pbVar15 = local_88;
      }
      puVar14 = local_80 + 1;
      if (uVar4 == '\a') {
        if (puVar8 + *(uint *)(puVar5 + 0x68) <= local_80 + 1) goto LAB_00256327;
        goto LAB_00255c77;
      }
      goto LAB_00255e4e;
    }
  }
  local_80 = puVar14;
  uVar16 = *(uint32_t *)(puVar5 + 0x98);
  goto LAB_00255eb4;
LAB_0025640d:
  local_80 = local_80 + 1;
LAB_00256113:
  Fax3PrematureEOF("Fax4Decode",tif,*(uint32_t *)(puVar5 + 0x98),uVar25);
  if (uVar24 != 0) {
    if (puVar8 + *(uint *)(puVar5 + 0x68) <= local_80) goto LAB_0025615e;
    *local_80 = uVar24;
    local_80 = local_80 + 1;
  }
  iVar13 = 0;
  if (uVar25 == lastx) goto LAB_002561d1;
  Fax3BadLength("Fax4Decode",tif,*(uint32_t *)(puVar5 + 0x98),uVar25,lastx);
  uVar11 = (long)local_80 - (long)puVar8;
  for (; ((int)lastx < (int)uVar25 && (puVar8 < local_80)); local_80 = local_80 + -1) {
    uVar25 = uVar25 - local_80[-1];
    uVar11 = uVar11 - 4;
  }
  if ((int)uVar25 < (int)lastx) {
    uVar16 = 0;
    if (0 < (int)uVar25) {
      uVar16 = uVar25;
    }
    if ((uVar11 & 4) == 0) {
LAB_002562b3:
      if (local_80 < puVar8 + *(uint *)(puVar5 + 0x68)) {
        *local_80 = lastx - uVar16;
        local_80 = local_80 + 1;
        goto LAB_0025631f;
      }
    }
    else if (local_80 < puVar8 + *(uint *)(puVar5 + 0x68)) {
      *local_80 = 0;
      local_80 = local_80 + 1;
      goto LAB_002562b3;
    }
LAB_00256327:
    uVar26 = *(uint *)(puVar5 + 0x98);
    bVar27 = (tif->tif_flags >> 10 & 1) == 0;
    pcVar21 = "tile";
    if (bVar27) {
      pcVar21 = "strip";
    }
    puVar12 = &tif->tif_curtile;
    if (bVar27) {
      puVar12 = &tif->tif_curstrip;
    }
    uVar17 = *puVar12;
LAB_0025636b:
    TIFFErrorExtR(tif,"Fax4Decode","Buffer overflow at line %u of %s %u",(ulong)uVar26,pcVar21,
                  (ulong)uVar17);
  }
  else {
    if ((int)lastx < (int)uVar25) {
      if ((puVar8 + *(uint *)(puVar5 + 0x68) <= local_80) ||
         (*local_80 = lastx, puVar8 + *(uint *)(puVar5 + 0x68) <= local_80 + 1)) goto LAB_00256327;
      local_80[1] = 0;
      local_80 = local_80 + 2;
LAB_0025631f:
      iVar13 = 0;
    }
LAB_002561d1:
    if (local_88 < pbVar10) {
      pbVar15 = local_88 + 1;
      uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)*local_88) << ((byte)iVar13 & 0x1f);
      iVar23 = iVar13 + 8;
      if (iVar13 < 5) {
        if (pbVar15 < pbVar10) {
          uVar26 = uVar26 | (uint)*(byte *)(lVar6 + (ulong)local_88[1]) << ((byte)iVar23 & 0x1f);
          iVar23 = iVar13 + 0x10;
          pbVar15 = local_88 + 2;
        }
        else {
          iVar23 = 0xd;
        }
      }
    }
    else {
      iVar23 = 0xd;
      pbVar15 = local_88;
      if (iVar13 == 0) {
        iVar23 = 0;
      }
    }
LAB_00256393:
    if (iVar9 <= (int)occ) {
      (**(code **)(puVar5 + 0x58))(buf,puVar8,local_80,lastx);
      *(int *)(puVar5 + 0x4c) = iVar23 + -0xd;
      *(uint *)(puVar5 + 0x48) = uVar26 >> 0xd;
      *(int *)(puVar5 + 0x50) = local_54;
      tif->tif_rawcc = (tmsize_t)(tif->tif_rawcp + (tif->tif_rawcc - (long)pbVar15));
      tif->tif_rawcp = pbVar15;
      return -(uint)(*(int *)(puVar5 + 0x98) == 0) | 1;
    }
LAB_0025639a:
    TIFFErrorExtR(tif,"Fax4Decode","Buffer overrun detected : %ld bytes available, %d bits needed",
                  occ);
  }
  return -1;
}

Assistant:

static int Fax4Decode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    DECLARE_STATE_2D(tif, sp, "Fax4Decode");
    (void)s;
    if (occ % sp->b.rowbytes)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (-1);
    }
    CACHE_STATE(tif, sp);
    while (occ > 0)
    {
        a0 = 0;
        RunLength = 0;
        pa = thisrun = sp->curruns;
        pb = sp->refruns;
        b1 = *pb++;
#ifdef FAX3_DEBUG
        printf("\nBitAcc=%08" PRIX32 ", BitsAvail = %d\n", BitAcc, BitsAvail);
        printf("-------------------- %d\n", tif->tif_row);
        fflush(stdout);
#endif
        EXPAND2D(EOFG4);
        if (EOLcnt)
            goto EOFG4;
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        SETVALUE(0); /* imaginary change for reference */
        SWAP(uint32_t *, sp->curruns, sp->refruns);
        buf += sp->b.rowbytes;
        occ -= sp->b.rowbytes;
        sp->line++;
        continue;
    EOFG4:
        NeedBits16(13, BADG4);
    BADG4:
#ifdef FAX3_DEBUG
        if (GetBits(13) != 0x1001)
            fputs("Bad EOFB\n", stderr);
#endif
        ClrBits(13);
        if (((lastx + 7) >> 3) > (int)occ) /* check for buffer overrun */
        {
            TIFFErrorExtR(tif, module,
                          "Buffer overrun detected : %" TIFF_SSIZE_FORMAT
                          " bytes available, %d bits needed",
                          occ, lastx);
            return -1;
        }
        (*sp->fill)(buf, thisrun, pa, lastx);
        UNCACHE_STATE(tif, sp);
        return (sp->line ? 1 : -1); /* don't error on badly-terminated strips */
    }
    UNCACHE_STATE(tif, sp);
    return (1);
}